

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trigonometric.hpp
# Opt level: O0

Vector4<mt::Dual<float>_> * __thiscall
mt::logLerpUnit<mt::Dual<float>,float>
          (Vector4<mt::Dual<float>_> *__return_storage_ptr__,mt *this,Vector4<mt::Dual<float>_> *u1,
          Vector4<mt::Dual<float>_> *u2,float t)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Vector3<float> VVar10;
  Vector3<mt::Dual<float>_> local_bc4;
  Vector3<mt::Dual<float>_> local_bac;
  undefined8 local_b94;
  undefined8 local_b8c;
  undefined8 local_b84;
  float local_b7c;
  Vector4<mt::Dual<float>_> *pVStack_b78;
  float t_local;
  Vector4<mt::Dual<float>_> *u2_local;
  Vector4<mt::Dual<float>_> *u1_local;
  ulong local_b60;
  undefined8 local_b58;
  ulong local_b50;
  undefined8 local_b48;
  undefined8 local_b40;
  undefined1 local_b38 [16];
  Vector3<float> local_b28;
  anon_union_16_2_77b3086c_for_Vector4<float>_1 local_b18;
  Vector3<float> local_b08;
  Vector4<mt::Dual<float>_> *local_af8;
  Vector4<mt::Dual<float>_> *local_af0;
  undefined1 local_ae8 [24];
  Vector4<mt::Dual<float>_> *local_ad0;
  undefined1 local_ac8 [24];
  Vector4<mt::Dual<float>_> *local_ab0;
  undefined1 local_aa8 [24];
  Dual<float> *local_a90;
  Dual<float> *local_a88;
  Dual<float> *local_a80;
  Vector4<mt::Dual<float>_> *local_a78;
  Dual<float> *local_a70;
  Dual<float> *local_a68;
  Dual<float> *local_a60;
  Vector4<mt::Dual<float>_> *local_a58;
  Dual<float> *local_a50;
  Dual<float> *local_a48;
  Dual<float> *local_a40;
  Vector4<mt::Dual<float>_> *local_a38;
  Vector3<float> *local_a30;
  ulong local_a28;
  ulong local_a20;
  undefined8 local_a18;
  ulong local_a10;
  undefined8 local_a08;
  undefined8 local_a00;
  undefined1 local_9f8 [16];
  Vector3<float> local_9e8;
  anon_union_16_2_77b3086c_for_Vector4<float>_1 local_9d8;
  Vector3<float> local_9c8;
  mt *local_9b8;
  mt *local_9b0;
  undefined1 local_9a8 [24];
  mt *local_990;
  undefined1 local_988 [24];
  mt *local_970;
  undefined1 local_968 [24];
  mt *local_950;
  mt *local_948;
  mt *local_940;
  mt *local_938;
  mt *local_930;
  mt *local_928;
  mt *local_920;
  mt *local_918;
  mt *local_910;
  mt *local_908;
  mt *local_900;
  mt *local_8f8;
  Vector3<float> *local_8f0;
  undefined8 local_8e8;
  float local_8e0;
  undefined8 local_8d8;
  float local_8d0;
  anon_union_16_2_77b3086c_for_Vector4<float>_1 local_8c8;
  Vector3<float> local_8b8;
  Vector3<float> local_8a8;
  undefined1 local_898 [8];
  Vector4<float> q;
  Vector3<float> local_864;
  undefined8 local_858;
  float local_850;
  undefined8 local_848;
  undefined8 local_83c;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  long local_818;
  long local_810;
  undefined8 local_808;
  float local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined8 *local_7f0;
  float local_7e4;
  float local_7e0;
  float local_7dc;
  Vector3<float> *local_7d8;
  float local_7d0;
  uint local_7cc;
  uint local_7c8;
  uint local_7c4;
  undefined1 *local_7c0;
  ulong local_7b8;
  ulong uStack_7b0;
  float local_7a0;
  uint local_79c;
  uint local_798;
  uint local_794;
  float local_790;
  float local_78c;
  float local_788;
  float local_784;
  undefined1 *local_780;
  undefined8 local_778;
  undefined8 uStack_770;
  float local_760;
  float local_75c;
  float local_758;
  float local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined4 local_744;
  undefined1 *local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  float local_710;
  float local_70c;
  float local_708;
  float local_704;
  undefined1 *local_700;
  Vector4<mt::Dual<float>_> *local_6f8;
  ulong uStack_6f0;
  float local_6e0;
  float local_6dc;
  float local_6d8;
  float local_6d4;
  float local_6d0;
  float local_6cc;
  float local_6c8;
  float local_6c4;
  undefined1 *local_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  float local_6a0;
  float local_69c;
  float local_698;
  float local_694;
  float local_690;
  float local_68c;
  float local_688;
  float local_684;
  undefined1 *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  float local_668;
  float local_664;
  float local_660;
  float local_65c;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  mt *local_610;
  mt *local_608;
  mt *local_600;
  mt *local_5f8;
  mt *local_5f0;
  mt *local_5e8;
  mt *local_5e0;
  mt *local_5d8;
  Dual<float> *local_5d0;
  Dual<float> *local_5c8;
  Dual<float> *local_5c0;
  Vector4<mt::Dual<float>_> *local_5b8;
  Dual<float> *local_5b0;
  Dual<float> *local_5a8;
  Dual<float> *local_5a0;
  Vector4<mt::Dual<float>_> *local_598;
  long local_590;
  long local_588;
  undefined8 local_580;
  mt *local_578;
  mt *local_570;
  mt *local_568;
  mt *local_560;
  Dual<float> *local_558;
  Dual<float> *local_550;
  Dual<float> *local_548;
  Vector4<mt::Dual<float>_> *local_540;
  undefined1 *local_538;
  undefined8 *local_530;
  undefined1 local_528 [24];
  float local_510;
  float local_50c;
  float local_508;
  float local_504;
  undefined1 *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4e8;
  float local_4e4;
  float local_4e0;
  float local_4dc;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined1 local_4c8 [24];
  float local_4b0;
  float local_4ac;
  float local_4a8;
  float local_4a4;
  undefined1 *local_4a0;
  undefined1 local_498 [16];
  float local_488;
  float local_484;
  float local_480;
  float local_47c;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined1 local_468 [24];
  float local_450;
  float local_44c;
  float local_448;
  float local_444;
  undefined1 *local_440;
  undefined1 local_438 [24];
  float local_420;
  float local_41c;
  float local_418;
  float local_414;
  ulong *local_410;
  undefined1 local_408 [24];
  float local_3f0;
  uint local_3ec;
  uint local_3e8;
  uint local_3e4;
  undefined1 *local_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  float local_3c0;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  Vector4<mt::Dual<float>_> **local_3b0;
  undefined1 local_3a8 [24];
  float local_390;
  float local_38c;
  float local_388;
  float local_384;
  undefined1 *local_380;
  ulong local_378;
  ulong uStack_370;
  float local_35c;
  float local_358;
  float local_354;
  float local_350;
  undefined8 local_34c;
  undefined8 local_344;
  undefined8 local_33c;
  undefined8 local_334;
  undefined8 local_32c;
  undefined8 local_324;
  float local_31c;
  Vector3<mt::Dual<float>_> *local_318;
  Vector3<mt::Dual<float>_> *local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 local_2d0;
  float local_2c8;
  float local_2c4;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 local_288;
  float local_280;
  float local_27c;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 local_240;
  float local_238;
  float local_234;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined8 local_1fc;
  undefined8 local_1f4;
  undefined8 local_1ec;
  undefined8 local_1e4;
  undefined8 local_1dc;
  undefined8 local_1d4;
  float local_1cc;
  Vector3<mt::Dual<float>_> *local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b4;
  undefined8 local_1ac;
  undefined8 local_1a4;
  undefined8 local_19c;
  undefined8 local_194;
  undefined8 local_18c;
  float local_184;
  Vector3<mt::Dual<float>_> *local_180;
  undefined8 *local_178;
  undefined8 local_16c;
  undefined8 local_164;
  undefined8 local_15c;
  float local_154;
  Dual<float> *local_150;
  undefined8 local_148;
  float local_140;
  float local_13c;
  undefined8 *local_138;
  Dual<float> *local_130;
  Dual<float> *local_128;
  float local_11c;
  Dual<float> *local_118;
  undefined8 local_110;
  float local_108;
  float local_104;
  undefined8 *local_100;
  Dual<float> *local_f8;
  Dual<float> *local_f0;
  float local_e4;
  Vector3<mt::Dual<float>_> *local_e0;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  undefined8 *local_c8;
  Vector3<mt::Dual<float>_> *local_c0;
  Vector3<mt::Dual<float>_> *local_b8;
  float local_ac;
  Dual<float> *local_a8;
  undefined8 local_a0;
  float local_98;
  float local_94;
  undefined8 *local_90;
  Dual<float> *local_88;
  Dual<float> *local_80;
  float local_74;
  Dual<float> *local_70;
  undefined8 local_68;
  float local_60;
  float local_5c;
  undefined8 *local_58;
  Dual<float> *local_50;
  Dual<float> *local_48;
  float local_3c;
  Vector3<mt::Dual<float>_> *local_38;
  undefined8 local_30;
  float local_28;
  float local_24;
  undefined8 *local_20;
  Vector3<mt::Dual<float>_> *local_18;
  Vector3<mt::Dual<float>_> *local_10;
  
  local_744 = *(undefined4 *)this;
  local_940 = this + 8;
  local_748 = *(undefined4 *)local_940;
  local_948 = this + 0x10;
  local_74c = *(undefined4 *)local_948;
  local_950 = this + 0x18;
  local_750 = *(undefined4 *)local_950;
  local_740 = local_988;
  local_9d8._8_8_ = CONCAT44(local_750,local_74c);
  local_9d8._0_8_ = CONCAT44(local_748,local_744);
  local_b7c = t;
  pVStack_b78 = u1;
  u2_local = (Vector4<mt::Dual<float>_> *)this;
  local_9b8 = this;
  local_990 = this;
  local_938 = this;
  local_738 = local_9d8._0_8_;
  uStack_730 = local_9d8._8_8_;
  local_720 = local_750;
  local_71c = local_74c;
  local_718 = local_748;
  local_714 = local_744;
  local_5f0 = local_950;
  local_5e8 = local_948;
  local_5e0 = local_940;
  local_5d8 = this;
  VVar10 = logUnit<float>((Vector4<float> *)&local_9d8.field_0);
  local_9e8.z = VVar10.z;
  local_9c8.z = local_9e8.z;
  local_9e8._0_8_ = VVar10._0_8_;
  local_9c8.x = local_9e8.x;
  local_9c8.y = local_9e8.y;
  local_970 = local_9b8;
  local_8f8 = local_9b8;
  local_560 = local_9b8;
  local_784 = *(float *)(local_9b8 + 4);
  local_900 = local_9b8 + 8;
  local_788 = *(float *)(local_9b8 + 0xc);
  local_908 = local_9b8 + 0x10;
  local_78c = *(float *)(local_9b8 + 0x14);
  local_910 = local_9b8 + 0x18;
  local_790 = *(float *)(local_9b8 + 0x1c);
  local_780 = local_968;
  local_a00 = CONCAT44(local_790,local_78c);
  local_a08 = CONCAT44(local_788,local_784);
  local_9b0 = local_9b8;
  local_918 = local_9b8;
  local_5f8 = local_9b8;
  local_7c4 = *(uint *)local_9b8;
  local_920 = local_9b8 + 8;
  local_7c8 = *(uint *)local_920;
  local_928 = local_9b8 + 0x10;
  local_7cc = *(uint *)local_928;
  local_930 = local_9b8 + 0x18;
  local_7d0 = *(float *)local_930;
  local_7c0 = local_9a8;
  local_a20 = CONCAT44(local_7d0,local_7cc);
  local_a28 = CONCAT44(local_7c8,local_7c4);
  local_410 = &local_a28;
  local_3e4 = local_7c4 ^ 0x80000000;
  local_3e8 = local_7c8 ^ 0x80000000;
  local_3ec = local_7cc ^ 0x80000000;
  local_3e0 = local_408;
  local_a10 = local_a20 ^ 0x80000000;
  local_3d8 = local_a28 ^ 0x8000000080000000;
  local_4d0 = &local_a08;
  local_4d8 = &local_a18;
  local_a18._0_4_ = (float)local_3d8;
  local_a18._4_4_ = (float)(local_3d8 >> 0x20);
  local_4a4 = (local_790 * (float)local_a18 + local_784 * local_7d0 + local_788 * (float)local_a10)
              - local_78c * local_a18._4_4_;
  local_4a8 = (local_790 * local_a18._4_4_ + local_788 * local_7d0 + local_78c * (float)local_a18) -
              local_784 * (float)local_a10;
  local_4ac = (local_790 * (float)local_a10 + local_78c * local_7d0 + local_784 * local_a18._4_4_) -
              local_788 * (float)local_a18;
  local_4b0 = ((local_790 * local_7d0 - local_784 * (float)local_a18) - local_788 * local_a18._4_4_)
              - local_78c * (float)local_a10;
  local_4a0 = local_4c8;
  local_9f8._8_8_ = CONCAT44(local_4b0,local_4ac);
  local_9f8._4_4_ = local_4a8;
  local_9f8._0_4_ = local_4a4;
  local_8f0 = (Vector3<float> *)local_9f8;
  local_a18 = local_3d8;
  local_9e8 = VVar10;
  local_7b8 = local_a28;
  uStack_7b0 = local_a20;
  local_7a0 = local_7d0;
  local_79c = local_7cc;
  local_798 = local_7c8;
  local_794 = local_7c4;
  local_778 = local_a08;
  uStack_770 = local_a00;
  local_760 = local_790;
  local_75c = local_78c;
  local_758 = local_788;
  local_754 = local_784;
  local_610 = local_930;
  local_608 = local_928;
  local_600 = local_920;
  local_578 = local_910;
  local_570 = local_908;
  local_568 = local_900;
  local_498._0_8_ = local_9f8._0_8_;
  local_498._8_8_ = local_9f8._8_8_;
  local_488 = local_4b0;
  local_484 = local_4ac;
  local_480 = local_4a8;
  local_47c = local_4a4;
  local_3f0 = local_7d0;
  uStack_3d0 = local_a10;
  local_3c0 = local_7d0;
  local_3bc = local_3ec;
  local_3b8 = local_3e8;
  local_3b4 = local_3e4;
  makeDual<float>(&local_bac,&local_9c8,local_8f0);
  local_af8 = pVStack_b78;
  local_ad0 = pVStack_b78;
  local_a78 = pVStack_b78;
  local_598 = pVStack_b78;
  local_684 = (pVStack_b78->x).mReal;
  local_a80 = &pVStack_b78->y;
  local_688 = local_a80->mReal;
  local_a88 = &pVStack_b78->z;
  local_68c = local_a88->mReal;
  local_a90 = &pVStack_b78->w;
  local_690 = local_a90->mReal;
  local_680 = local_ac8;
  local_b18._8_8_ = CONCAT44(local_690,local_68c);
  local_b18._0_8_ = CONCAT44(local_688,local_684);
  local_678 = local_b18._0_8_;
  uStack_670 = local_b18._8_8_;
  local_668 = local_690;
  local_664 = local_68c;
  local_660 = local_688;
  local_65c = local_684;
  local_5b0 = local_a90;
  local_5a8 = local_a88;
  local_5a0 = local_a80;
  local_b28 = logUnit<float>((Vector4<float> *)&local_b18.field_0);
  local_ab0 = local_af8;
  local_a38 = local_af8;
  local_540 = local_af8;
  local_6c4 = (local_af8->x).mDual;
  local_a40 = &local_af8->y;
  local_6c8 = (local_af8->y).mDual;
  local_a48 = &local_af8->z;
  local_6cc = (local_af8->z).mDual;
  local_a50 = &local_af8->w;
  local_6d0 = (local_af8->w).mDual;
  local_6c0 = local_aa8;
  local_b40 = CONCAT44(local_6d0,local_6cc);
  local_b48 = CONCAT44(local_6c8,local_6c4);
  local_af0 = local_af8;
  local_a58 = local_af8;
  local_5b8 = local_af8;
  local_704 = (local_af8->x).mReal;
  local_a60 = &local_af8->y;
  local_708 = local_a60->mReal;
  local_a68 = &local_af8->z;
  local_70c = local_a68->mReal;
  local_a70 = &local_af8->w;
  local_710 = local_a70->mReal;
  local_700 = local_ae8;
  local_b60 = CONCAT44(local_710,local_70c);
  u1_local = (Vector4<mt::Dual<float>_> *)CONCAT44(local_708,local_704);
  local_3b0 = &u1_local;
  local_384 = -local_704;
  local_388 = -local_708;
  local_38c = -local_70c;
  local_380 = local_3a8;
  local_b50 = local_b60 ^ 0x80000000;
  local_378 = (ulong)u1_local ^ 0x8000000080000000;
  local_470 = &local_b48;
  local_478 = &local_b58;
  local_b58._0_4_ = (float)local_378;
  local_b58._4_4_ = (float)(local_378 >> 0x20);
  local_444 = (local_6d0 * (float)local_b58 + local_6c4 * local_710 + local_6c8 * (float)local_b50)
              - local_6cc * local_b58._4_4_;
  local_448 = (local_6d0 * local_b58._4_4_ + local_6c8 * local_710 + local_6cc * (float)local_b58) -
              local_6c4 * (float)local_b50;
  local_44c = (local_6d0 * (float)local_b50 + local_6cc * local_710 + local_6c4 * local_b58._4_4_) -
              local_6c8 * (float)local_b58;
  local_450 = ((local_6d0 * local_710 - local_6c4 * (float)local_b58) - local_6c8 * local_b58._4_4_)
              - local_6cc * (float)local_b50;
  local_440 = local_468;
  local_b38._8_8_ = CONCAT44(local_450,local_44c);
  local_b38._4_4_ = local_448;
  local_b38._0_4_ = local_444;
  local_a30 = (Vector3<float> *)local_b38;
  local_b58 = local_378;
  local_6f8 = u1_local;
  uStack_6f0 = local_b60;
  local_6e0 = local_710;
  local_6dc = local_70c;
  local_6d8 = local_708;
  local_6d4 = local_704;
  local_6b8 = local_b48;
  uStack_6b0 = local_b40;
  local_6a0 = local_6d0;
  local_69c = local_6cc;
  local_698 = local_6c8;
  local_694 = local_6c4;
  local_5d0 = local_a70;
  local_5c8 = local_a68;
  local_5c0 = local_a60;
  local_558 = local_a50;
  local_550 = local_a48;
  local_548 = local_a40;
  local_438._0_8_ = local_b38._0_8_;
  local_438._8_8_ = local_b38._8_8_;
  local_420 = local_450;
  local_41c = local_44c;
  local_418 = local_448;
  local_414 = local_444;
  local_390 = local_710;
  uStack_370 = local_b50;
  local_35c = local_710;
  local_358 = local_38c;
  local_354 = local_388;
  local_350 = local_384;
  local_b08 = local_b28;
  makeDual<float>(&local_bc4,&local_b08,local_a30);
  local_31c = local_b7c;
  local_184 = 1.0 - local_b7c;
  local_cc = local_bac.x.mReal * local_184;
  local_d0 = local_bac.x.mDual * local_184;
  local_c8 = &local_d8;
  local_d8._0_4_ = local_cc;
  local_d8._4_4_ = local_d0;
  local_18c = local_d8;
  local_118 = &local_bac.y;
  local_104 = local_bac.y.mReal * local_184;
  local_108 = local_bac.y.mDual * local_184;
  local_100 = &local_110;
  local_110._0_4_ = local_104;
  local_110._4_4_ = local_108;
  local_194 = local_110;
  local_150 = &local_bac.z;
  local_13c = local_bac.z.mReal * local_184;
  local_140 = local_bac.z.mDual * local_184;
  local_138 = &local_148;
  local_148._0_4_ = local_13c;
  local_148._4_4_ = local_140;
  local_19c = local_148;
  local_15c = local_d8;
  local_164 = local_110;
  local_16c = local_148;
  local_2e8 = &local_334;
  local_334 = local_d8;
  uVar7 = local_334;
  local_32c = local_110;
  uVar8 = local_32c;
  local_324 = local_148;
  uVar9 = local_324;
  local_1cc = local_b7c;
  local_3c = local_b7c;
  local_24 = local_bc4.x.mReal * local_b7c;
  local_28 = local_bc4.x.mDual * local_b7c;
  local_20 = &local_30;
  local_30._0_4_ = local_24;
  local_30._4_4_ = local_28;
  local_1d4 = local_30;
  local_70 = &local_bc4.y;
  local_74 = local_b7c;
  local_5c = local_bc4.y.mReal * local_b7c;
  local_60 = local_bc4.y.mDual * local_b7c;
  local_58 = &local_68;
  local_68._0_4_ = local_5c;
  local_68._4_4_ = local_60;
  local_1dc = local_68;
  local_a8 = &local_bc4.z;
  local_ac = local_b7c;
  local_94 = local_bc4.z.mReal * local_b7c;
  local_98 = local_bc4.z.mDual * local_b7c;
  local_90 = &local_a0;
  local_a0._0_4_ = local_94;
  local_a0._4_4_ = local_98;
  local_1e4 = local_a0;
  local_1a4 = local_30;
  local_1ac = local_68;
  local_1b4 = local_a0;
  local_2f0 = &local_34c;
  local_34c = local_30;
  uVar4 = local_34c;
  local_344 = local_68;
  uVar5 = local_344;
  local_33c = local_a0;
  uVar6 = local_33c;
  local_334._0_4_ = (float)local_d8;
  local_34c._0_4_ = (float)local_30;
  local_234 = (float)local_334 + (float)local_34c;
  local_334._4_4_ = (float)((ulong)local_d8 >> 0x20);
  local_34c._4_4_ = (float)((ulong)local_30 >> 0x20);
  local_238 = local_334._4_4_ + local_34c._4_4_;
  local_230 = &local_240;
  local_240._0_4_ = local_234;
  local_240._4_4_ = local_238;
  local_2f8 = local_240;
  local_290 = &local_32c;
  local_298 = &local_344;
  local_32c._0_4_ = (float)local_110;
  local_344._0_4_ = (float)local_68;
  local_27c = (float)local_32c + (float)local_344;
  local_32c._4_4_ = (float)((ulong)local_110 >> 0x20);
  local_344._4_4_ = (float)((ulong)local_68 >> 0x20);
  local_280 = local_32c._4_4_ + local_344._4_4_;
  local_278 = &local_288;
  local_288._0_4_ = local_27c;
  local_288._4_4_ = local_280;
  local_300 = local_288;
  local_2d8 = &local_324;
  local_2e0 = &local_33c;
  local_324._0_4_ = (float)local_148;
  local_33c._0_4_ = (float)local_a0;
  local_2c4 = (float)local_324 + (float)local_33c;
  local_324._4_4_ = (float)((ulong)local_148 >> 0x20);
  local_33c._4_4_ = (float)((ulong)local_a0 >> 0x20);
  local_2c8 = local_324._4_4_ + local_33c._4_4_;
  local_2c0 = &local_2d0;
  local_2d0._0_4_ = local_2c4;
  local_2d0._4_4_ = local_2c8;
  local_308 = local_2d0;
  local_1ec = local_240;
  local_1f4 = local_288;
  local_1fc = local_2d0;
  q.field_0._8_8_ = &local_b94;
  local_b94 = local_240;
  uVar1 = local_b94;
  local_b8c = local_288;
  uVar2 = local_b8c;
  local_b84 = local_2d0;
  uVar3 = local_b84;
  local_b94._0_4_ = (float)local_240;
  local_7dc = (float)local_b94;
  local_828 = &local_b8c;
  local_b8c._0_4_ = (float)local_288;
  local_7e0 = (float)local_b8c;
  local_830 = &local_b84;
  local_b84._0_4_ = (float)local_2d0;
  local_7e4 = (float)local_b84;
  local_7d8 = &local_864;
  local_864.x = (float)local_b94;
  local_864.y = (float)local_b8c;
  local_8b8.z = (float)local_b84;
  local_8b8.x = local_864.x;
  local_8b8.y = local_864.y;
  local_8a8.z = (float)local_b84;
  local_8a8.x = local_864.x;
  local_8a8.y = local_864.y;
  local_820 = (undefined8 *)q.field_0._8_8_;
  local_640 = (undefined8 *)q.field_0._8_8_;
  local_638 = (undefined8 *)q.field_0._8_8_;
  local_630 = (undefined8 *)q.field_0._8_8_;
  local_628 = local_830;
  local_620 = local_828;
  local_618 = (undefined8 *)q.field_0._8_8_;
  local_318 = &local_bc4;
  local_310 = &local_bac;
  local_2b8 = local_2e0;
  local_2b0 = local_2d8;
  local_2a8 = local_2e0;
  local_2a0 = local_2d8;
  local_270 = local_298;
  local_268 = local_290;
  local_260 = local_298;
  local_258 = local_290;
  local_250 = local_2f0;
  local_248 = local_2e8;
  local_228 = local_2f0;
  local_220 = local_2e8;
  local_218 = local_2f0;
  local_210 = local_2e8;
  local_208 = (undefined8 *)q.field_0._8_8_;
  local_1c8 = &local_bc4;
  local_1c0 = local_2f0;
  local_180 = &local_bac;
  local_178 = local_2e8;
  local_154 = local_184;
  local_130 = local_150;
  local_128 = local_150;
  local_11c = local_184;
  local_f8 = local_118;
  local_f0 = local_118;
  local_e4 = local_184;
  local_e0 = &local_bac;
  local_c0 = &local_bac;
  local_b8 = &local_bac;
  local_88 = local_a8;
  local_80 = local_a8;
  local_50 = local_70;
  local_48 = local_70;
  local_38 = &local_bc4;
  local_18 = &local_bc4;
  local_10 = &local_bc4;
  local_b94 = uVar1;
  local_b8c = uVar2;
  local_b84 = uVar3;
  local_34c = uVar4;
  local_344 = uVar5;
  local_33c = uVar6;
  local_334 = uVar7;
  local_32c = uVar8;
  local_324 = uVar9;
  _local_898 = (anon_struct_16_4_d86d922e_for_anon_union_16_2_77b3086c_for_Vector4<float>_1_0)
               exp<float>(&local_8a8);
  local_848 = q.field_0._8_8_;
  local_648 = q.field_0._8_8_;
  local_808 = q.field_0._8_8_;
  local_580 = q.field_0._8_8_;
  local_7f4 = *(undefined4 *)(q.field_0._8_8_ + 4);
  local_650 = q.field_0._8_8_;
  local_810 = q.field_0._8_8_ + 8;
  local_7f8 = *(undefined4 *)(q.field_0._8_8_ + 0xc);
  local_658 = q.field_0._8_8_;
  local_818 = q.field_0._8_8_ + 0x10;
  local_8e0 = *(float *)(q.field_0._8_8_ + 0x14);
  local_7f0 = &local_83c;
  local_83c._0_4_ = local_7f4;
  local_83c._4_4_ = local_7f8;
  local_858 = local_83c;
  local_8e8 = local_83c;
  local_8d8 = local_83c;
  uVar1 = local_8d8;
  local_530 = &local_8d8;
  local_538 = local_898;
  local_8d8._0_4_ = (float)local_83c;
  local_8d8._4_4_ = (float)((ulong)local_83c >> 0x20);
  local_504 = ((float)local_8d8 * q.field_0.field_0.y + local_8d8._4_4_ * q.field_0.field_0.x) -
              local_8e0 * (float)local_898._4_4_;
  local_508 = (local_8d8._4_4_ * q.field_0.field_0.y + local_8e0 * (float)local_898._0_4_) -
              (float)local_8d8 * q.field_0.field_0.x;
  local_50c = (local_8e0 * q.field_0.field_0.y + (float)local_8d8 * (float)local_898._4_4_) -
              local_8d8._4_4_ * (float)local_898._0_4_;
  local_510 = (-(float)local_8d8 * (float)local_898._0_4_ - local_8d8._4_4_ * (float)local_898._4_4_
              ) - local_8e0 * q.field_0.field_0.x;
  local_500 = local_528;
  local_8c8._8_8_ = CONCAT44(local_510,local_50c);
  local_8c8._0_8_ = CONCAT44(local_508,local_504);
  local_8d8 = uVar1;
  local_8d0 = local_8e0;
  local_850 = local_8e0;
  local_7fc = local_8e0;
  local_590 = local_818;
  local_588 = local_810;
  local_4f8 = local_8c8._0_8_;
  uStack_4f0 = local_8c8._8_8_;
  local_4e8 = local_510;
  local_4e4 = local_50c;
  local_4e0 = local_508;
  local_4dc = local_504;
  makeDual<float>(__return_storage_ptr__,(Vector4<float> *)local_898,
                  (Vector4<float> *)&local_8c8.field_0);
  return __return_storage_ptr__;
}

Assistant:

Vector4<Scalar1> logLerpUnit(const Vector4<Scalar1>& u1, const Vector4<Scalar1>& u2, Scalar2 t)
    {
        return exp(lerp(logUnit(u1), logUnit(u2), t));  
    }